

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O2

void xcb_input_feedback_ctl_next(xcb_input_feedback_ctl_iterator_t *i)

{
  int iVar1;
  xcb_input_feedback_ctl_t *pxVar2;
  
  pxVar2 = i->data;
  iVar1 = xcb_input_feedback_ctl_sizeof(pxVar2);
  pxVar2 = (xcb_input_feedback_ctl_t *)(&pxVar2->class_id + iVar1);
  i->index = (int)pxVar2 - *(int *)&i->data;
  i->rem = i->rem + -1;
  i->data = pxVar2;
  return;
}

Assistant:

void
xcb_input_feedback_ctl_next (xcb_input_feedback_ctl_iterator_t *i)
{
    xcb_input_feedback_ctl_t *R = i->data;
    xcb_generic_iterator_t child;
    child.data = (xcb_input_feedback_ctl_t *)(((char *)R) + xcb_input_feedback_ctl_sizeof(R));
    i->index = (char *) child.data - (char *) i->data;
    --i->rem;
    i->data = (xcb_input_feedback_ctl_t *) child.data;
}